

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase32::run(TestCase32 *this)

{
  size_t in_RDX;
  size_t extraout_RDX;
  StringPtr filename;
  StringPtr filename_00;
  ArrayPtr<const_char> local_58;
  DebugComparison<kj::StringPtr,_const_char_(&)[22]> _kjCondition;
  
  filename.content.size_ = in_RDX;
  filename.content.ptr = (char *)0x66;
  local_58 = (ArrayPtr<const_char>)
             trimSourceFilename((kj *)
                                "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                                ,filename);
  DebugExpression<kj::StringPtr>::operator==
            (&_kjCondition,(DebugExpression<kj::StringPtr> *)&local_58,(char (*) [22])0x1d7b34);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    filename_00.content.size_ = extraout_RDX;
    filename_00.content.ptr = (char *)0x66;
    local_58 = (ArrayPtr<const_char>)
               trimSourceFilename((kj *)
                                  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                                  ,filename_00);
    Debug::
    log<char_const(&)[172],kj::_::DebugComparison<kj::StringPtr,char_const(&)[22]>&,kj::StringPtr,char_const(&)[22]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x25,ERROR,
               "\"failed: expected \" \"(trimSourceFilename(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++\\\")) == (\\\"kj/exception-test.c++\\\")\", _kjCondition, trimSourceFilename(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++\"), \"kj/exception-test.c++\""
               ,(char (*) [172])
                "failed: expected (trimSourceFilename(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++\")) == (\"kj/exception-test.c++\")"
               ,&_kjCondition,(StringPtr *)&local_58,(char (*) [22])0x1d7b34);
  }
  return;
}

Assistant:

TEST(Exception, TrimSourceFilename) {
#if _WIN32
  EXPECT_TRUE(trimSourceFilename(__FILE__) == "kj/exception-test.c++" ||
              trimSourceFilename(__FILE__) == "kj\\exception-test.c++");
#else
  EXPECT_EQ(trimSourceFilename(__FILE__), "kj/exception-test.c++");
#endif
}